

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEquipment.cpp
# Opt level: O3

Watt __thiscall CompositeEquipment::Power(CompositeEquipment *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  Watt WVar5;
  long *plVar3;
  
  iVar2 = (*(this->super_Equipment)._vptr_Equipment[7])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)*plVar3)(plVar3);
  cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
  WVar5 = 0;
  if (cVar1 == '\0') {
    WVar5 = 0;
    do {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3);
      iVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
      WVar5 = WVar5 + iVar2;
      (**(code **)(*plVar3 + 8))(plVar3);
      cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
    } while (cVar1 == '\0');
  }
  operator_delete(plVar3);
  return WVar5;
}

Assistant:

Watt CompositeEquipment::Power() {
    Iterator<Equipment*>* i = CreateIterator(); // ERRATUM: book had different iterator.
    Watt total = 0;

    for (i->First(); !i->IsDone(); i->Next()) {
        total += i->CurrentItem()->Power();
    }
    delete i;
    return total;
}